

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O0

void external_editor_timer(void *param_1)

{
  uint uVar1;
  int iVar2;
  Fl_Code_Type *code;
  Fl_Type *p;
  int modified;
  int editors_open;
  void *param_0_local;
  
  uVar1 = ExternalCodeEditor::editors_open();
  if (G_debug != 0) {
    printf("--- TIMER --- External editors open=%d\n",(ulong)uVar1);
  }
  if (0 < (int)uVar1) {
    p._0_4_ = 0;
    for (code = (Fl_Code_Type *)Fl_Type::first; code != (Fl_Code_Type *)0x0;
        code = (Fl_Code_Type *)(code->super_Fl_Type).next) {
      iVar2 = (*(code->super_Fl_Type)._vptr_Fl_Type[0x22])();
      if (iVar2 != 0) {
        iVar2 = Fl_Code_Type::handle_editor_changes(code);
        if (iVar2 != 0) {
          p._0_4_ = (int)p + 1;
        }
        iVar2 = Fl_Code_Type::is_editing(code);
        if (iVar2 != 0) {
          Fl_Code_Type::reap_editor(code);
        }
      }
    }
    if ((int)p != 0) {
      set_modflag(1);
    }
  }
  iVar2 = ExternalCodeEditor::editors_open();
  if (iVar2 != 0) {
    Fl::repeat_timeout(2.0,external_editor_timer,(void *)0x0);
  }
  return;
}

Assistant:

static void external_editor_timer(void*) {
  int editors_open = ExternalCodeEditor::editors_open();
  if ( G_debug ) printf("--- TIMER --- External editors open=%d\n", editors_open);
  if ( editors_open > 0 ) {
    // Walk tree looking for files modified by external editors.
    int modified = 0;
    for (Fl_Type *p = Fl_Type::first; p; p = p->next) {
      if ( p->is_code() ) {
        Fl_Code_Type *code = (Fl_Code_Type*)p;
        // Code changed by external editor?
        if ( code->handle_editor_changes() ) {	// updates ram, file size/mtime
          modified++;
        }
        if ( code->is_editing() ) {             // editor open?
          code->reap_editor();                  // Try to reap; maybe it recently closed
        }
      }
    }
    if ( modified ) set_modflag(1);
  }
  // Repeat timeout if editors still open
  //    The ExternalCodeEditor class handles start/stopping timer, we just
  //    repeat_timeout() if it's already on. NOTE: above code may have reaped
  //    only open editor, which would disable further timeouts. So *recheck*
  //    if editors still open, to ensure we don't accidentally re-enable them.
  //
  if ( ExternalCodeEditor::editors_open() ) {
    Fl::repeat_timeout(2.0, external_editor_timer);
  }
}